

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityMarking.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::EntityMarking::GetEntityMarkingString_abi_cxx11_
          (KString *__return_storage_ptr__,EntityMarking *this)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,this->m_sEntityMarkingString,&local_9);
  return __return_storage_ptr__;
}

Assistant:

KString EntityMarking::GetEntityMarkingString() const
{
    return m_sEntityMarkingString;
}